

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,char *cend)

{
  bool bVar1;
  Value *pVVar2;
  reference ppVar3;
  int in_EDX;
  char *in_RSI;
  CZString *in_RDI;
  Value *value;
  value_type defaultValue;
  iterator it;
  CZString actualKey;
  ostringstream oss;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd48;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd50;
  const_iterator in_stack_fffffffffffffd58;
  Value *in_stack_fffffffffffffd60;
  undefined6 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6e;
  undefined1 uVar4;
  pair<const_Json::Value::CZString,_Json::Value> *this_00;
  CZString *in_stack_fffffffffffffd98;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_260;
  _Base_ptr local_258;
  undefined4 local_214;
  _Self local_210;
  _Self local_208;
  pair<const_Json::Value::CZString,_Json::Value> local_200;
  ostringstream local_198 [376];
  int local_20;
  char *local_18;
  Value *local_8;
  
  if ((((uint)in_RDI->field_1 & 0xff) != 0) && (((uint)in_RDI->field_1 & 0xff) != 7)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,
                    "in Json::Value::resolveReference(key, end): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)in_stack_fffffffffffffd60);
  }
  local_18 = in_RSI;
  local_20 = in_EDX;
  if (((uint)in_RDI->field_1 & 0xff) == 0) {
    pVVar2 = &local_200.second;
    Value(in_stack_fffffffffffffd60,(ValueType)((ulong)in_stack_fffffffffffffd58._M_node >> 0x20));
    operator=((Value *)in_stack_fffffffffffffd50,(Value *)in_stack_fffffffffffffd48);
    ~Value(pVVar2);
  }
  this_00 = &local_200;
  CZString::CZString(&this_00->first,local_18,local_20 - (int)local_18,duplicateOnCopy);
  local_208._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                      *)in_stack_fffffffffffffd48,(key_type *)0x1fa7fb);
  local_210._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffd48);
  bVar1 = std::operator!=(&local_208,&local_210);
  uVar4 = false;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x1fa855);
    in_stack_fffffffffffffd6e = CZString::operator==(in_stack_fffffffffffffd98,in_RDI);
    uVar4 = in_stack_fffffffffffffd6e;
  }
  if ((bool)uVar4 == false) {
    pVVar2 = nullSingleton();
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              (this_00,(CZString *)
                       CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffd6e,in_stack_fffffffffffffd68))
               ,pVVar2);
    in_stack_fffffffffffffd50 = (pair<const_Json::Value::CZString,_Json::Value> *)in_RDI->cstr_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_260,&local_208);
    local_258 = (_Base_ptr)
                std::
                map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                          ((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                            *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,
                           in_stack_fffffffffffffd48);
    local_208._M_node = local_258;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x1fa944);
    local_8 = &ppVar3->second;
    local_214 = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair(in_stack_fffffffffffffd50);
  }
  else {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x1fa88c);
    local_8 = &ppVar3->second;
    local_214 = 1;
  }
  CZString::~CZString(&in_stack_fffffffffffffd50->first);
  return local_8;
}

Assistant:

Value& Value::resolveReference(char const* key, char const* cend)
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(key, end): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(cend-key), CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullSingleton());
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}